

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

uint cimg_library::cimg::sleep(uint __seconds)

{
  uint uVar1;
  timespec tv;
  timespec local_10;
  
  local_10.tv_sec = (ulong)__seconds / 1000;
  local_10.tv_nsec = (long)((__seconds % 1000) * 1000000);
  uVar1 = nanosleep(&local_10,(timespec *)0x0);
  return uVar1;
}

Assistant:

inline void sleep(const unsigned int milliseconds) {
#if cimg_OS==1
      struct timespec tv;
      tv.tv_sec = milliseconds/1000;
      tv.tv_nsec = (milliseconds%1000)*1000000;
      nanosleep(&tv,0);
#elif cimg_OS==2
      Sleep(milliseconds);
#else
      cimg::unused(milliseconds);
#endif
    }